

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  CURLMcode CVar1;
  undefined1 auStack_38 [4];
  CURLMcode mresult;
  easy_pollset cur_poll;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  cur_poll._24_8_ = data;
  multi_getsock(data,(easy_pollset *)auStack_38);
  CVar1 = Curl_multi_pollset_ev
                    (multi,(Curl_easy *)cur_poll._24_8_,(easy_pollset *)auStack_38,
                     (easy_pollset *)(cur_poll._24_8_ + 0xa0));
  if (CVar1 == CURLM_OK) {
    *(undefined8 *)(cur_poll._24_8_ + 0xa0) = _auStack_38;
    *(undefined8 *)(cur_poll._24_8_ + 0xa8) = cur_poll.sockets._0_8_;
    *(undefined8 *)(cur_poll._24_8_ + 0xb0) = cur_poll.sockets._8_8_;
    *(undefined8 *)(cur_poll._24_8_ + 0xb8) = cur_poll._16_8_;
  }
  return CVar1;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  CURLMcode mresult;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);
  mresult = Curl_multi_pollset_ev(multi, data, &cur_poll, &data->last_poll);

  if(!mresult) /* Remember for next time */
    memcpy(&data->last_poll, &cur_poll, sizeof(cur_poll));
  return mresult;
}